

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Browser_.cxx
# Opt level: O0

int __thiscall Fl_Browser_::displayed(Fl_Browser_ *this,void *item)

{
  int iVar1;
  undefined4 extraout_var;
  void *local_40;
  void *l;
  int local_30;
  int yy;
  int H;
  int W;
  int Y;
  int X;
  void *item_local;
  Fl_Browser_ *this_local;
  
  _Y = item;
  item_local = this;
  bbox(this,&W,&H,&yy,&local_30);
  l._4_4_ = local_30 + this->offset_;
  local_40 = this->top_;
  while( true ) {
    if (local_40 == (void *)0x0 || l._4_4_ < 1) {
      return 0;
    }
    if (local_40 == _Y) break;
    iVar1 = (*(this->super_Fl_Group).super_Fl_Widget._vptr_Fl_Widget[0xe])(this,local_40);
    l._4_4_ = l._4_4_ - iVar1;
    iVar1 = (*(this->super_Fl_Group).super_Fl_Widget._vptr_Fl_Widget[0xb])(this,local_40);
    local_40 = (void *)CONCAT44(extraout_var,iVar1);
  }
  return 1;
}

Assistant:

int Fl_Browser_::displayed(void* item) const {
  int X, Y, W, H; bbox(X, Y, W, H);
  int yy = H+offset_;
  for (void* l = top_; l && yy > 0; l = item_next(l)) {
    if (l == item) return 1;
    yy -= item_height(l);
  }
  return 0;
}